

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O2

void __thiscall GslSpan_FixedSizeConversions_Test::TestBody(GslSpan_FixedSizeConversions_Test *this)

{
  char *pcVar1;
  span<int,_1L> s1;
  AssertHelper local_38;
  AssertionResult gtest_ar;
  span<int,_4L> s4;
  int arr [4];
  
  s4.storage_.data_ = (storage_type<pstore::gsl::details::extent_type<4L>_>)arr;
  arr._0_8_ = &DAT_200000001;
  arr[2] = 3;
  arr[3] = 4;
  s1.storage_.data_ = (storage_type<pstore::gsl::details::extent_type<1L>_>)&DAT_00000004;
  local_38.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"s4.length ()","4",(long *)&s1,(int *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&s1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x529,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&s1);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (s1.storage_.data_ != (pointer)0x0) {
      (**(code **)(*(long *)s1.storage_.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  s1.storage_.data_ = (storage_type<pstore::gsl::details::extent_type<1L>_>)&DAT_00000004;
  local_38.data_ = (AssertHelperData *)&DAT_00000004;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"s.length ()","s4.length ()",(long *)&s1,(long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&s1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x52e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&s1);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (s1.storage_.data_ != (pointer)0x0) {
      (**(code **)(*(long *)s1.storage_.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar = (AssertionResult)pstore::gsl::span<int,_4L>::first(&s4,1);
  pstore::gsl::span<int,1l>::span<int,_1l>((span<int,1l> *)&s1,(span<int,__1L> *)&gtest_ar);
  return;
}

Assistant:

TEST (GslSpan, FixedSizeConversions) {
    int arr[] = {1, 2, 3, 4};

    // converting to an span from an equal size array is ok
    span<int, 4> s4 = make_span (arr);
    EXPECT_EQ (s4.length (), 4);

    // converting to dynamic_range is always ok
    {
        span<int> s = s4;
        EXPECT_EQ (s.length (), s4.length ());
        static_cast<void> (s);
    }

// initialization or assignment to static span that REDUCES size is NOT ok
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 2> s = arr; }
    {
        span<int, 2> s2 = s4;
        static_cast<void> (s2);
    }
#endif

// even when done dynamically
#if 0
    {
        span<int> s = make_span (arr);
        auto f = [&]() {
            span<int, 2> s2 = s;
            static_cast<void>(s2);
        };
        CHECK_THROW(f(), fail_fast);
    }
#endif
    // but doing so explicitly is ok

    // you can convert statically
    {
        span<int, 2> s2 = {arr, 2};
        static_cast<void> (s2);
    }
    {
        span<int, 1> s1 = s4.first<1> ();
        static_cast<void> (s1);
    }

    // ...or dynamically
    {
        // NB: implicit conversion to span<int,1> from span<int>
        span<int, 1> s1 = s4.first (1);
        static_cast<void> (s1);
    }

// initialization or assignment to static span that requires size INCREASE is not ok.
#if 0
    int arr2[2] = {1, 2};
#endif
#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 4> s3 = arr2; }
    {
        span<int, 2> s2 = arr2;
        span<int, 4> s4a = s2;
    }
#endif
#if 0
    {
        auto f = [&]() {
            span<int, 4> s4 = {arr2, 2};
            static_cast<void>(s4);
        };
        CHECK_THROW(f(), fail_fast);
    }
    // this should fail - we are trying to assign a small dynamic span to a fixed_size larger one
    span<int> av = arr2;
    auto f = [&]() {
        span<int, 4> s4 = av;
        static_cast<void>(s4);
    };
    CHECK_THROW(f(), fail_fast);
#endif
}